

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void autocovar_fft(auto_fft_object obj,double *vec,double *acov,int M)

{
  uint uVar1;
  int N;
  uint uVar2;
  double *inp;
  double *oup;
  fft_data *oup_00;
  fft_data *inp_00;
  ulong uVar3;
  long lVar4;
  size_t __size;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = obj->clen;
  N = obj->ilen;
  if ((int)uVar1 < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    uVar2 = uVar1 - 1;
  }
  else {
    uVar2 = 0;
    if (0 < M) {
      uVar2 = M;
    }
  }
  __size = (long)(int)uVar1 << 4;
  inp = (double *)malloc(__size);
  oup = (double *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  inp_00 = (fft_data *)malloc(__size);
  dVar6 = mean(vec,N);
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    dVar7 = 0.0;
    if ((long)uVar3 < (long)N) {
      dVar7 = vec[uVar3] - dVar6;
    }
    inp[uVar3] = dVar7;
  }
  fft_r2c_exec(obj->fobj,inp,oup_00);
  for (lVar4 = 0; uVar5 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    dVar6 = *(double *)((long)&oup_00->re + lVar4);
    dVar7 = *(double *)((long)&oup_00->im + lVar4);
    *(double *)((long)&inp_00->re + lVar4) = dVar6 * dVar6 + dVar7 * dVar7;
    *(undefined8 *)((long)&inp_00->im + lVar4) = 0;
  }
  fft_c2r_exec(obj->iobj,inp_00,oup);
  uVar5 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar5;
  }
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    acov[uVar5] = oup[uVar5] / (double)(int)(N * uVar1);
  }
  free(inp);
  free(oup);
  free(oup_00);
  free(inp_00);
  return;
}

Assistant:

void autocovar_fft(auto_fft_object obj,double* vec,double* acov, int M) {
	int i,N,L,N2;
	double m;
	fft_type* a;
	fft_type* b;
	fft_data* ao;
	fft_data* bo;
	
	N = obj->clen;
	L = obj->ilen;
	N2 = N * L;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	
	a = (fft_type*) malloc (sizeof(fft_data) * N);
	b = (fft_type*) malloc (sizeof(fft_data) * N);
	ao = (fft_data*) malloc (sizeof(fft_data) * N);
	bo = (fft_data*) malloc (sizeof(fft_data) * N);
	
	m = mean(vec,L);
	
	for (i = 0; i < N;i++) {
		if (i < L) {
			a[i] = vec[i] - m;
		} else {
			a[i] = 0.0;
		}
	
	}
	
	fft_r2c_exec(obj->fobj,a,ao);
	
	for (i = 0; i < N;i++) {
		bo[i].re = ao[i].re * ao[i].re + ao[i].im * ao[i].im;
		bo[i].im = 0.0;
	}
	
	fft_c2r_exec(obj->iobj,bo,b);
	
	for (i = 0; i < M;i++) {
		acov[i] = b[i]/N2;
	}
	
	free(a);
	free(b);
	free(ao);
	free(bo);

}